

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ElemSegment::ElemSegment(ElemSegment *this,string_view name)

{
  Location local_40;
  ElemSegment *local_20;
  ElemSegment *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (ElemSegment *)name.data_;
  this->kind = Active;
  local_20 = this;
  string_view::to_string_abi_cxx11_(&this->name,(string_view *)&this_local);
  Location::Location(&local_40);
  Var::Var(&this->table_var,0xffffffff,&local_40);
  intrusive_list<wabt::Expr>::intrusive_list(&this->offset);
  std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::vector(&this->elem_exprs);
  return;
}

Assistant:

explicit ElemSegment(string_view name) : name(name.to_string()) {}